

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual>::RelationalOp
          (RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual> *this,
          GeneratorState *state,Type operatorToken,ConstValueRangeAccess inValueRange)

{
  ValueRangeAccess valueRange_00;
  byte bVar1;
  bool bVar2;
  VariableType *pVVar3;
  Random *pRVar4;
  bool *pbVar5;
  float *aMin;
  float *aMax;
  float *bMin;
  float *bMax;
  int *aMin_00;
  int *aMax_00;
  int *bMin_00;
  int *bMax_00;
  ValueAccess VVar6;
  ConstStridedValueAccess<1> local_450;
  ConstStridedValueAccess<1> local_440;
  ConstStridedValueAccess<1> local_430;
  ConstStridedValueAccess<1> local_420;
  ComputeGreaterOrEqualRange local_409;
  ConstStridedValueAccess<1> local_408;
  ConstStridedValueAccess<1> local_3f8;
  ConstStridedValueAccess<1> local_3e8;
  ConstStridedValueAccess<1> local_3d8;
  ComputeGreaterOrEqualRange local_3c1;
  undefined1 local_3c0 [8];
  ValueRangeAccess b;
  ValueRangeAccess a;
  undefined1 auStack_378 [7];
  bool dstMax;
  Scalar *local_370;
  byte local_361;
  undefined1 local_360 [7];
  bool dstMin;
  ValueRange local_310;
  VariableType local_290;
  ValueRange local_240;
  Type local_1bc;
  Type TStack_1b8;
  Type inBaseType;
  Type inBaseTypes [2];
  Scalar *pSStack_1a8;
  Scalar *local_1a0;
  VariableType local_198;
  ValueRange local_148;
  VariableType *local_b8;
  Scalar *pSStack_b0;
  Scalar *local_a8;
  undefined1 local_a0 [8];
  ValueRange valueRange;
  Type operatorToken_local;
  GeneratorState *state_local;
  RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual> *this_local;
  
  valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = operatorToken;
  BinaryOp<7,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<7,_(rsg::Associativity)0>,operatorToken);
  (this->super_BinaryOp<7,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__RelationalOp_032ec008;
  local_a8 = inValueRange.m_max;
  local_b8 = inValueRange.m_type;
  pSStack_b0 = inValueRange.m_min;
  ValueRange::ValueRange((ValueRange *)local_a0,inValueRange);
  pVVar3 = ValueRange::getType((ValueRange *)local_a0);
  bVar2 = VariableType::isVoid(pVVar3);
  if (bVar2) {
    VariableType::VariableType(&local_198,TYPE_BOOL,1);
    ValueRange::ValueRange(&local_148,&local_198);
    ValueRange::operator=((ValueRange *)local_a0,&local_148);
    ValueRange::~ValueRange(&local_148);
    VariableType::~VariableType(&local_198);
    ValueRange::asAccess((ValueRangeAccess *)inBaseTypes,(ValueRange *)local_a0);
    valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_1a8;
    valueRange_00.super_ConstValueRangeAccess.m_type = (VariableType *)inBaseTypes;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_1a0;
    computeRandomValueRange(state,valueRange_00);
  }
  pVVar3 = ValueRange::getType((ValueRange *)local_a0);
  VariableType::operator=(&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_type,pVVar3);
  ValueStorage<64>::setStorage
            (&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_value,
             &(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_type);
  _TStack_1b8 = 0x200000001;
  pRVar4 = GeneratorState::getRandom(state);
  local_1bc = de::Random::choose<rsg::VariableType::Type,rsg::VariableType::Type*>
                        (pRVar4,&TStack_1b8,inBaseTypes);
  VariableType::VariableType(&local_290,local_1bc,1);
  ValueRange::ValueRange(&local_240,&local_290);
  ValueRange::operator=
            (&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_rightValueRange,&local_240);
  ValueRange::~ValueRange(&local_240);
  VariableType::~VariableType(&local_290);
  VariableType::VariableType((VariableType *)local_360,local_1bc,1);
  ValueRange::ValueRange(&local_310,(VariableType *)local_360);
  ValueRange::operator=
            (&(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_leftValueRange,&local_310);
  ValueRange::~ValueRange(&local_310);
  VariableType::~VariableType((VariableType *)local_360);
  _auStack_378 = (ConstStridedValueAccess<1>)ValueRange::getMin((ValueRange *)local_a0);
  pbVar5 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)auStack_378);
  local_361 = *pbVar5 & 1;
  VVar6 = ValueRange::getMax((ValueRange *)local_a0);
  a.super_ConstValueRangeAccess.m_max = (Scalar *)VVar6.super_ConstStridedValueAccess<1>.m_type;
  pbVar5 = StridedValueAccess<1>::asBool
                     ((StridedValueAccess<1> *)&a.super_ConstValueRangeAccess.m_max);
  bVar2 = *pbVar5;
  ValueRange::asAccess
            ((ValueRangeAccess *)&b.super_ConstValueRangeAccess.m_max,
             &(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_leftValueRange);
  ValueRange::asAccess
            ((ValueRangeAccess *)local_3c0,
             &(this->super_BinaryOp<7,_(rsg::Associativity)0>).m_rightValueRange);
  if (local_1bc == TYPE_FLOAT) {
    pRVar4 = GeneratorState::getRandom(state);
    bVar1 = local_361;
    local_3d8 = (ConstStridedValueAccess<1>)
                ValueRangeAccess::getMin((ValueRangeAccess *)&b.super_ConstValueRangeAccess.m_max);
    aMin = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_3d8);
    local_3e8 = (ConstStridedValueAccess<1>)
                ValueRangeAccess::getMax((ValueRangeAccess *)&b.super_ConstValueRangeAccess.m_max);
    aMax = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_3e8);
    local_3f8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_3c0);
    bMin = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_3f8);
    local_408 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_3c0);
    bMax = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_408);
    ComputeGreaterOrEqualRange::operator()
              (&local_3c1,pRVar4,(bool)(bVar1 & 1),(bool)(bVar2 & 1U),aMin,aMax,bMin,bMax);
  }
  else {
    if (local_1bc == TYPE_INT) {
      pRVar4 = GeneratorState::getRandom(state);
      bVar1 = local_361;
      local_420 = (ConstStridedValueAccess<1>)
                  ValueRangeAccess::getMin((ValueRangeAccess *)&b.super_ConstValueRangeAccess.m_max)
      ;
      aMin_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_420);
      local_430 = (ConstStridedValueAccess<1>)
                  ValueRangeAccess::getMax((ValueRangeAccess *)&b.super_ConstValueRangeAccess.m_max)
      ;
      aMax_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_430);
      local_440 = (ConstStridedValueAccess<1>)
                  ValueRangeAccess::getMin((ValueRangeAccess *)local_3c0);
      bMin_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_440);
      local_450 = (ConstStridedValueAccess<1>)
                  ValueRangeAccess::getMax((ValueRangeAccess *)local_3c0);
      bMax_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_450);
      ComputeGreaterOrEqualRange::operator()
                (&local_409,pRVar4,(bool)(bVar1 & 1),(bool)(bVar2 & 1U),aMin_00,aMax_00,bMin_00,
                 bMax_00);
    }
  }
  ValueRange::~ValueRange((ValueRange *)local_a0);
  return;
}

Assistant:

RelationalOp<ComputeValueRange, EvaluateComp>::RelationalOp (GeneratorState& state, Token::Type operatorToken, ConstValueRangeAccess inValueRange)
	: BinaryOp<7, ASSOCIATIVITY_LEFT>(operatorToken)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		valueRange = ValueRange(VariableType(VariableType::TYPE_BOOL, 1));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Choose random input type
	VariableType::Type inBaseTypes[]	= { VariableType::TYPE_FLOAT, VariableType::TYPE_INT };
	VariableType::Type inBaseType		= state.getRandom().choose<VariableType::Type>(&inBaseTypes[0], &inBaseTypes[DE_LENGTH_OF_ARRAY(inBaseTypes)]);

	// Initialize storage for input value ranges
	this->m_rightValueRange	= ValueRange(VariableType(inBaseType, 1));
	this->m_leftValueRange	= ValueRange(VariableType(inBaseType, 1));

	// Compute range for b that satisfies requested value range
	{
		bool					dstMin	= valueRange.getMin().asBool();
		bool					dstMax	= valueRange.getMax().asBool();
		ValueRangeAccess		a		= this->m_leftValueRange.asAccess();
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess();

		if (inBaseType == VariableType::TYPE_FLOAT)
			ComputeValueRange()(state.getRandom(), dstMin, dstMax,
								a.getMin().asFloat(), a.getMax().asFloat(),
								b.getMin().asFloat(), b.getMax().asFloat());
		else if (inBaseType == VariableType::TYPE_INT)
			ComputeValueRange()(state.getRandom(), dstMin, dstMax,
								a.getMin().asInt(), a.getMax().asInt(),
								b.getMin().asInt(), b.getMax().asInt());
	}
}